

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestMessageWithCustomOptions::~TestMessageWithCustomOptions
          (TestMessageWithCustomOptions *this)

{
  ~TestMessageWithCustomOptions(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TestMessageWithCustomOptions::~TestMessageWithCustomOptions() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMessageWithCustomOptions)
  SharedDtor(*this);
}